

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatrices
          (EigenDecompositionCube<double,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,double **transitionMatrices,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  int i;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  double *pdVar23;
  int iVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double sumD1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double sumD2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar21 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  uVar22 = (ulong)uVar21;
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    for (uVar14 = 0; uVar14 != (uint)(~(count >> 0x1f) & count); uVar14 = uVar14 + 1) {
      iVar24 = 0;
      pdVar8 = transitionMatrices[probabilityIndices[uVar14]];
      for (lVar13 = 0; lVar13 < (this->super_EigenDecomposition<double,_1>).kCategoryCount;
          lVar13 = lVar13 + 1) {
        lVar17 = 0;
        while( true ) {
          uVar12 = (uint)uVar22;
          lVar10 = (long)(int)uVar12;
          if (lVar10 <= lVar17) break;
          dVar25 = exp(edgeLengths[uVar14] * categoryRates[lVar13] *
                       (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex][lVar17])
          ;
          (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar17] = dVar25;
          lVar17 = lVar17 + 1;
          uVar22 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kStateCount;
        }
        pdVar16 = this->gCMatrices[eigenIndex];
        for (uVar20 = 0; uVar20 != (~((int)uVar12 >> 0x1f) & uVar12); uVar20 = uVar20 + 1) {
          iVar11 = uVar12 + iVar24;
          for (lVar17 = (long)iVar24; lVar17 != iVar11; lVar17 = lVar17 + 1) {
            pdVar9 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
            auVar27 = ZEXT816(0) << 0x40;
            pdVar23 = pdVar16;
            for (lVar18 = 0; lVar18 < (int)uVar21 / 4 << 2; lVar18 = lVar18 + 4) {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = pdVar16[lVar18];
              auVar33._8_8_ = 0;
              auVar33._0_8_ = pdVar16[lVar18 + 1];
              pdVar23 = pdVar23 + 4;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar9[lVar18];
              auVar32 = vfmadd231sd_fma(auVar27,auVar29,auVar1);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = pdVar16[lVar18 + 2];
              auVar27._8_8_ = 0;
              auVar27._0_8_ = pdVar9[lVar18 + 1];
              auVar27 = vfmadd231sd_fma(auVar32,auVar33,auVar27);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = pdVar9[lVar18 + 2];
              auVar27 = vfmadd132sd_fma(auVar30,auVar27,auVar2);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = pdVar16[lVar18 + 3];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pdVar9[lVar18 + 3];
              auVar27 = vfmadd132sd_fma(auVar28,auVar27,auVar3);
            }
            for (; lVar18 < lVar10; lVar18 = lVar18 + 1) {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *pdVar23;
              pdVar23 = pdVar23 + 1;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = pdVar9[lVar18];
              auVar27 = vfmadd231sd_fma(auVar27,auVar31,auVar32);
            }
            auVar27 = vmaxsd_avx(auVar27,ZEXT816(0) << 0x40);
            pdVar16 = pdVar16 + lVar10;
            pdVar8[lVar17] = auVar27._0_8_;
          }
          pdVar8[iVar11] = 1.0;
          iVar24 = iVar11 + 1;
        }
      }
    }
  }
  else {
    uVar14 = (ulong)(uint)(~(count >> 0x1f) & count);
    if (secondDerivativeIndices == (int *)0x0) {
      for (uVar19 = 0; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        iVar24 = 0;
        pdVar8 = transitionMatrices[probabilityIndices[uVar19]];
        pdVar16 = transitionMatrices[firstDerivativeIndices[uVar19]];
        for (lVar13 = 0; lVar13 < (this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar13 = lVar13 + 1) {
          for (lVar17 = 0; uVar21 = (uint)uVar22, lVar17 < (int)uVar21; lVar17 = lVar17 + 1) {
            dVar25 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex][lVar17] *
                     categoryRates[lVar13];
            dVar26 = exp(dVar25 * edgeLengths[uVar19]);
            (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar17] = dVar26;
            (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar17] = dVar26 * dVar25;
            uVar22 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kStateCount;
          }
          iVar11 = 0;
          for (uVar12 = 0; uVar12 != (~((int)uVar21 >> 0x1f) & uVar21); uVar12 = uVar12 + 1) {
            lVar10 = (long)(int)(uVar21 + iVar24);
            for (lVar17 = (long)iVar24; lVar17 != lVar10; lVar17 = lVar17 + 1) {
              auVar27 = ZEXT816(0) << 0x40;
              auVar32 = ZEXT816(0) << 0x40;
              for (uVar15 = 0; uVar22 != uVar15; uVar15 = uVar15 + 1) {
                auVar35._8_8_ = 0;
                auVar35._0_8_ = this->gCMatrices[eigenIndex][(long)iVar11 + uVar15];
                auVar34._8_8_ = 0;
                auVar34._0_8_ = (this->super_EigenDecomposition<double,_1>).matrixTmp[uVar15];
                auVar27 = vfmadd231sd_fma(auVar27,auVar35,auVar34);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = (this->super_EigenDecomposition<double,_1>).firstDerivTmp[uVar15];
                auVar32 = vfmadd231sd_fma(auVar32,auVar35,auVar7);
              }
              auVar27 = vmaxsd_avx(auVar27,ZEXT816(0) << 0x40);
              iVar11 = iVar11 + uVar21;
              pdVar8[lVar17] = auVar27._0_8_;
              pdVar16[lVar17] = auVar32._0_8_;
            }
            pdVar8[lVar10] = 1.0;
            pdVar16[lVar10] = 0.0;
            iVar24 = uVar21 + iVar24 + 1;
          }
        }
      }
    }
    else {
      for (uVar19 = 0; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        iVar24 = 0;
        pdVar8 = transitionMatrices[probabilityIndices[uVar19]];
        pdVar16 = transitionMatrices[firstDerivativeIndices[uVar19]];
        pdVar9 = transitionMatrices[secondDerivativeIndices[uVar19]];
        for (lVar13 = 0; lVar13 < (this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar13 = lVar13 + 1) {
          for (lVar17 = 0; uVar21 = (uint)uVar22, lVar17 < (int)uVar21; lVar17 = lVar17 + 1) {
            dVar25 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex][lVar17] *
                     categoryRates[lVar13];
            dVar26 = exp(dVar25 * edgeLengths[uVar19]);
            (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar17] = dVar26;
            (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar17] = dVar25 * dVar26;
            (this->super_EigenDecomposition<double,_1>).secondDerivTmp[lVar17] =
                 dVar25 * dVar25 * dVar26;
            uVar22 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kStateCount;
          }
          iVar11 = 0;
          for (uVar12 = 0; uVar12 != (~((int)uVar21 >> 0x1f) & uVar21); uVar12 = uVar12 + 1) {
            lVar10 = (long)(int)(uVar21 + iVar24);
            for (lVar17 = (long)iVar24; lVar17 != lVar10; lVar17 = lVar17 + 1) {
              auVar27 = ZEXT816(0) << 0x40;
              auVar32 = ZEXT816(0) << 0x40;
              auVar34 = ZEXT816(0) << 0x40;
              uVar15 = 0;
              while( true ) {
                if (uVar22 == uVar15) break;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = this->gCMatrices[eigenIndex][(long)iVar11 + uVar15];
                auVar4._8_8_ = 0;
                auVar4._0_8_ = (this->super_EigenDecomposition<double,_1>).matrixTmp[uVar15];
                auVar27 = vfmadd231sd_fma(auVar27,auVar36,auVar4);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = (this->super_EigenDecomposition<double,_1>).firstDerivTmp[uVar15];
                auVar32 = vfmadd231sd_fma(auVar32,auVar36,auVar5);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = (this->super_EigenDecomposition<double,_1>).secondDerivTmp[uVar15];
                auVar34 = vfmadd231sd_fma(auVar34,auVar36,auVar6);
                uVar15 = uVar15 + 1;
              }
              auVar27 = vmaxsd_avx(auVar27,ZEXT816(0) << 0x40);
              iVar11 = iVar11 + uVar21;
              pdVar8[lVar17] = auVar27._0_8_;
              pdVar16[lVar17] = auVar32._0_8_;
              pdVar9[lVar17] = auVar34._0_8_;
            }
            pdVar8[lVar10] = 1.0;
            pdVar16[lVar10] = 0.0;
            pdVar9[lVar10] = 0.0;
            iVar24 = uVar21 + iVar24 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}